

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O3

void amrex::VisMF::readFAB(FabArray<amrex::FArrayBox> *mf,int idx,string *mf_name,Header *hdr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  BaseFab<double> *this;
  bool bVar3;
  int iVar4;
  ifstream *is;
  double *out;
  RealDescriptor *rd;
  string FullName;
  string local_50;
  
  iVar4 = FabArrayBase::localindex(&mf->super_FabArrayBase,idx);
  this = &(mf->m_fabs_v).super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar4]->super_BaseFab<double>;
  DirName(&local_50,mf_name);
  std::__cxx11::string::_M_append
            ((char *)&local_50,
             *(ulong *)&(hdr->m_fod).
                        super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                        .
                        super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                        ._M_impl.super__Vector_impl_data._M_start[idx].m_name._M_dataplus);
  is = OpenStream(&local_50);
  std::istream::seekg((long)is,(_Ios_Seekdir)
                               (hdr->m_fod).
                               super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                               .
                               super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                               ._M_impl.super__Vector_impl_data._M_start[idx].m_head);
  if (hdr->m_vers - 2U < 3) {
    out = BaseFab<double>::dataPtr(this,0);
    rd = FPC::NativeRealDescriptor();
    bVar3 = RealDescriptor::operator==(&hdr->m_writtenRD,rd);
    if (bVar3) {
      std::istream::read((char *)is,(long)out);
    }
    else {
      uVar1 = *(undefined8 *)(this->domain).bigend.vect;
      uVar2 = *(undefined8 *)(this->domain).smallend.vect;
      RealDescriptor::convertToNativeFormat
                (out,(long)this->nvar *
                     (long)(((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) + 1) *
                     (long)(((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1) *
                     (long)(((int)uVar1 - (int)uVar2) + 1),(istream *)is,&hdr->m_writtenRD);
    }
  }
  else {
    FArrayBox::readFrom((FArrayBox *)this,(istream *)is);
  }
  CloseStream(&local_50,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
VisMF::readFAB (FabArray<FArrayBox> &mf,
                int                  idx,
                const std::string&   mf_name,
                const VisMF::Header& hdr)
{
//    BL_PROFILE("VisMF::readFAB_mf");
    FArrayBox &fab = mf[idx];

    std::string FullName(VisMF::DirName(mf_name));
    FullName += hdr.m_fod[idx].m_name;

    std::ifstream *infs = VisMF::OpenStream(FullName);
    infs->seekg(hdr.m_fod[idx].m_head, std::ios::beg);

    if(NoFabHeader(hdr)) {
      Real* fabdata = fab.dataPtr();
#ifdef AMREX_USE_GPU
      std::unique_ptr<FArrayBox> hostfab;
      if (fab.arena()->isManaged() || fab.arena()->isDevice()) {
          hostfab = std::make_unique<FArrayBox>(fab.box(), fab.nComp(), The_Pinned_Arena());
          fabdata = hostfab->dataPtr();
      }
#endif
      if(hdr.m_writtenRD == FPC::NativeRealDescriptor()) {
        infs->read((char *) fabdata, fab.nBytes());
      } else {
        Long readDataItems(fab.box().numPts() * fab.nComp());
        RealDescriptor::convertToNativeFormat(fabdata, readDataItems,
                                              *infs, hdr.m_writtenRD);
      }
#ifdef AMREX_USE_GPU
      if (hostfab) {
          Gpu::htod_memcpy_async(fab.dataPtr(), hostfab->dataPtr(), fab.size()*sizeof(Real));
          Gpu::streamSynchronize();
      }
#endif
    } else {
      fab.readFrom(*infs);
    }

    VisMF::CloseStream(FullName);
}